

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

void __thiscall OpenMD::SC::calcForce(SC *this,InteractionData *idat)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference this_00;
  reference pvVar6;
  double *pdVar7;
  int *in_RSI;
  long in_RDI;
  double dVar8;
  double dVar9;
  RealType dudr;
  RealType pot_temp;
  RealType dvpdr;
  RealType vptmp;
  RealType drhodr;
  RealType rhtmp;
  RealType vcij;
  RealType rcij;
  SCInteractionData *mixer;
  SCAtomData *data2;
  SCAtomData *data1;
  int *sctid2;
  int *sctid1;
  Vector<double,_3U> *in_stack_ffffffffffffff28;
  Vector<double,_3U> *in_stack_ffffffffffffff30;
  Vector<double,_3U> *in_stack_ffffffffffffff38;
  double dVar10;
  SC *in_stack_ffffffffffffff60;
  double local_60;
  RealType *in_stack_ffffffffffffffa8;
  RealType *in_stack_ffffffffffffffb0;
  RealType *t;
  CubicSpline *this_01;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    initialize(in_stack_ffffffffffffff60);
  }
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)*in_RSI);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),(long)in_RSI[1]);
  pvVar4 = std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::operator[]
                     ((vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *)
                      (in_RDI + 0x78),(long)*pvVar2);
  pvVar5 = std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::operator[]
                     ((vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *)
                      (in_RDI + 0x78),(long)*pvVar3);
  this_00 = std::
            vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                          *)(in_RDI + 0x90),(long)*pvVar2);
  pvVar6 = std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::
           operator[](this_00,(long)*pvVar3);
  this_01 = (CubicSpline *)pvVar6->rCut;
  if (*(double *)(in_RSI + 8) < (double)this_01) {
    t = (RealType *)pvVar6->vCut;
    CubicSpline::getValueAndDerivativeAt
              (this_01,t,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    CubicSpline::getValueAndDerivativeAt
              (this_01,t,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    dVar8 = local_60 - (double)t;
    *(double *)(in_RSI + 0x34) = dVar8 + *(double *)(in_RSI + 0x34);
    OpenMD::operator*(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
    operator/(in_stack_ffffffffffffff38,(double)in_stack_ffffffffffffff30);
    Vector<double,_3U>::operator+=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    if ((*(byte *)(in_RSI + 0x36) & 1) != 0) {
      dVar10 = pvVar5->c;
      dVar1 = pvVar5->epsilon;
      dVar9 = sqrt(*(double *)(in_RSI + 0xb2) - (double)in_stack_ffffffffffffffb0);
      *(double *)(in_RSI + 0x46) =
           *(double *)(in_RSI + 0x46) - (dVar10 * dVar1 * dVar9 + *(double *)(in_RSI + 0xb6));
      dVar10 = pvVar4->c;
      dVar1 = pvVar4->epsilon;
      dVar9 = sqrt(*(double *)(in_RSI + 0xb0) - (double)in_stack_ffffffffffffffb0);
      *(double *)(in_RSI + 0x48) =
           *(double *)(in_RSI + 0x48) - (dVar10 * dVar1 * dVar9 + *(double *)(in_RSI + 0xb4));
    }
    dVar10 = dVar8;
    pdVar7 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x18),4);
    *pdVar7 = dVar10 + *pdVar7;
    if ((*(byte *)((long)in_RSI + 0xdb) & 1) != 0) {
      pdVar7 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x38),4);
      *pdVar7 = dVar8 + *pdVar7;
    }
  }
  return;
}

Assistant:

void SC::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    int& sctid1 = SCtids[idat.atid1];
    int& sctid2 = SCtids[idat.atid2];

    SCAtomData& data1 = SCdata[sctid1];
    SCAtomData& data2 = SCdata[sctid2];

    SCInteractionData& mixer = MixingMap[sctid1][sctid2];

    RealType rcij = mixer.rCut;

    if (idat.rij < rcij) {
      RealType vcij = mixer.vCut;
      RealType rhtmp, drhodr, vptmp, dvpdr;

      mixer.phi->getValueAndDerivativeAt(idat.rij, rhtmp, drhodr);
      mixer.V->getValueAndDerivativeAt(idat.rij, vptmp, dvpdr);

      RealType pot_temp = vptmp - vcij;
      idat.vpair += pot_temp;

      RealType dudr = drhodr * (idat.dfrho1 + idat.dfrho2) + dvpdr;

      idat.f1 += idat.d * dudr / idat.rij;

      if (idat.doParticlePot) {
        // particlePot is the difference between the full potential and
        // the full potential without the presence of a particular
        // particle (atom1).
        //
        // This reduces the density at other particle locations, so we
        // need to recompute the density at atom2 assuming atom1 didn't
        // contribute.  This then requires recomputing the density
        // functional for atom2 as well.

        idat.particlePot1 -=
            data2.c * data2.epsilon * sqrt(idat.rho2 - rhtmp) + idat.frho2;

        idat.particlePot2 -=
            data1.c * data1.epsilon * sqrt(idat.rho1 - rhtmp) + idat.frho1;
      }

      idat.pot[METALLIC_PAIR_FAMILY] += pot_temp;

      if (idat.isSelected) idat.selePot[METALLIC_PAIR_FAMILY] += pot_temp;
    }

    return;
  }